

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active_info.c
# Opt level: O0

double * inform_local_active_info
                   (int *series,size_t n,size_t m,int b,size_t k,double *ai,inform_error *err)

{
  _Bool _Var1;
  ulong uVar2;
  ulong uVar3;
  uint32_t *puVar4;
  void *__ptr;
  int *state_00;
  int *history_00;
  bool bVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong local_110;
  size_t i;
  double t;
  double s;
  double r;
  int *future;
  int *history;
  int *state;
  int *state_data;
  inform_dist futures;
  inform_dist histories;
  inform_dist states;
  uint32_t *histogram_data;
  size_t total_size;
  size_t futures_size;
  size_t histories_size;
  size_t states_size;
  _Bool allocate_ai;
  size_t N;
  double *ai_local;
  size_t k_local;
  int b_local;
  size_t m_local;
  size_t n_local;
  int *series_local;
  
  _Var1 = check_arguments(series,n,m,b,k,err);
  if (_Var1) {
    series_local = (int *)0x0;
  }
  else {
    uVar2 = n * (m - k);
    bVar5 = ai == (double *)0x0;
    N = (size_t)ai;
    if ((bVar5) && (N = (size_t)malloc(uVar2 * 8), (void *)N == (void *)0x0)) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
      series_local = (int *)0x0;
    }
    else {
      auVar7._8_4_ = (int)(k >> 0x20);
      auVar7._0_8_ = k;
      auVar7._12_4_ = 0x45300000;
      dVar6 = pow((double)b,
                  (auVar7._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)k) - 4503599627370496.0));
      dVar6 = (double)b * dVar6;
      uVar3 = (ulong)dVar6;
      uVar3 = uVar3 | (long)(dVar6 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f;
      puVar4 = (uint32_t *)(uVar3 / (ulong)(long)b);
      __ptr = calloc(uVar3 + (long)puVar4 + (long)b,4);
      if (__ptr == (void *)0x0) {
        if (bVar5) {
          free((void *)N);
        }
        if (err != (inform_error *)0x0) {
          *err = INFORM_ENOMEM;
        }
        series_local = (int *)0x0;
      }
      else {
        futures.counts = (long)__ptr + uVar3 * 4;
        state_data = (int *)((long)__ptr + (long)puVar4 * 4 + uVar3 * 4);
        futures.histogram = (uint32_t *)(long)b;
        futures.size = uVar2;
        histories.histogram = puVar4;
        histories.size = uVar2;
        histories.counts = (uint64_t)__ptr;
        state_00 = (int *)malloc(uVar2 * 0xc);
        if (state_00 == (int *)0x0) {
          if (bVar5) {
            free((void *)N);
          }
          free(__ptr);
          if (err != (inform_error *)0x0) {
            *err = INFORM_ENOMEM;
          }
          series_local = (int *)0x0;
        }
        else {
          history_00 = state_00 + uVar2;
          accumulate_local_observations
                    (series,n,m,b,k,(inform_dist *)&histories.counts,(inform_dist *)&futures.counts,
                     (inform_dist *)&state_data,state_00,history_00,history_00 + uVar2);
          for (local_110 = 0; local_110 < uVar2; local_110 = local_110 + 1) {
            auVar8._8_4_ = (int)(uVar2 >> 0x20);
            auVar8._0_8_ = uVar2;
            auVar8._12_4_ = 0x45300000;
            dVar6 = log2(((double)*(uint *)(histories.counts + (long)state_00[local_110] * 4) *
                         ((auVar8._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0))) /
                         ((double)*(uint *)(futures.counts + (long)history_00[local_110] * 4) *
                         (double)(uint)state_data[(history_00 + uVar2)[local_110]]));
            *(double *)(N + local_110 * 8) = dVar6;
          }
          free(state_00);
          free(__ptr);
          series_local = (int *)N;
        }
      }
    }
  }
  return (double *)series_local;
}

Assistant:

double *inform_local_active_info(int const *series, size_t n, size_t m, int b,
    size_t k, double *ai, inform_error *err)
{
    if (check_arguments(series, n, m, b, k, err)) return NULL;

    size_t const N = n * (m - k);

    bool allocate_ai = (ai == NULL);
    if (allocate_ai)
    {
        ai = malloc(N * sizeof(double));
        if (ai == NULL)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
    }

    size_t const states_size = (size_t) (b*pow((double) b,(double) k));
    size_t const histories_size = states_size / b;
    size_t const futures_size = b;
    size_t const total_size = states_size + histories_size + futures_size;

    uint32_t *histogram_data = calloc(total_size, sizeof(uint32_t));
    if (histogram_data == NULL)
    {
        if (allocate_ai) free(ai);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    inform_dist states    = { histogram_data, states_size, N };
    inform_dist histories = { histogram_data + states_size, histories_size, N };
    inform_dist futures   = { histogram_data + states_size + histories_size, futures_size, N };

    int *state_data = malloc(3 * N * sizeof(int));
    if (state_data == NULL)
    {
        if (allocate_ai) free(ai);
        free(histogram_data);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    int *state   = state_data;
    int *history = state + N;
    int *future  = history + N;

    accumulate_local_observations(series, n, m, b, k, &states, &histories,
        &futures, state, history, future);

    double r, s, t;
    for (size_t i = 0; i < N; ++i)
    {
        r = states.histogram[state[i]];
        s = histories.histogram[history[i]];
        t = futures.histogram[future[i]];
        ai[i] = log2((r * N) / (s * t));
    }

    free(state_data);
    free(histogram_data);

    return ai;
}